

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::DoRedeferFunction(FunctionBody *this,uint inactiveThreshold)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  EntryPointInfo *this_00;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar2;
  LoopEntryPointInfo *this_01;
  bool bVar3;
  bool bVar4;
  LocalFunctionId LVar5;
  uint uVar6;
  uint uVar7;
  LoopHeader *pLVar8;
  int i;
  long lVar9;
  ulong uVar10;
  int i_1;
  bool local_31 [8];
  bool overflow;
  
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr == this) {
    bVar3 = FunctionProxy::CanBeDeferred((FunctionProxy *)this);
    if (!bVar3) {
      return false;
    }
    if ((this->byteCodeBlock).ptr == (ByteBlock *)0x0) {
      return false;
    }
    bVar3 = GetCanDefer(this);
    if (bVar3) {
      uVar6 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                 m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
      LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01436260,RedeferralPhase,uVar6,LVar5);
      if (!bVar3) {
        uVar6 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                   m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
        LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
        bVar3 = Phases::IsEnabled((Phases *)&DAT_01439100,RedeferralPhase,uVar6,LVar5);
        if (!bVar3) {
          uVar6 = FunctionProxy::GetCompileCount((FunctionProxy *)this);
          if (DAT_0143ef00 <= uVar6) {
            return false;
          }
          local_31[0] = false;
          if (1 < uVar6) {
            uVar7 = JavascriptNumber::DirectPowIntInt(local_31,inactiveThreshold,uVar6);
            inactiveThreshold = 0xffffffff;
            if ((local_31[0] & 1U) == 0) {
              inactiveThreshold = uVar7;
            }
          }
          if (this->inactiveCount < inactiveThreshold) {
            return false;
          }
        }
      }
      bVar3 = IsInterpreterExecutionMode(this);
      pSVar1 = (this->entryPoints).ptr;
      if (pSVar1 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                     *)0x0) {
        for (lVar9 = 0;
            lVar9 < (pSVar1->
                    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ).
                    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                    .count; lVar9 = lVar9 + 1) {
          this_00 = (EntryPointInfo *)
                    (((pSVar1->
                      super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                      .buffer.ptr[lVar9].ptr)->super_RecyclerWeakReferenceBase).strongRef;
          if (this_00 != (EntryPointInfo *)0x0) {
            bVar4 = EntryPointInfo::IsCodeGenPending(this_00);
            if (bVar4 && !bVar3) {
              return false;
            }
            bVar4 = EntryPointInfo::IsCodeGenQueued(this_00);
            if (bVar4) {
              return false;
            }
            bVar4 = EntryPointInfo::IsCodeGenRecorded(this_00);
            if (bVar4) {
              return false;
            }
            bVar4 = EntryPointInfo::IsCodeGenDone(this_00);
            if ((bVar4) && ((this_00->field_0x18 & 0x10) == 0)) {
              return false;
            }
          }
        }
      }
      pLVar8 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                         ((FunctionProxy *)this);
      if (pLVar8 == (LoopHeader *)0x0) {
        return true;
      }
      uVar6 = GetLoopCount(this);
      uVar10 = 0;
      do {
        if (uVar10 == uVar6) {
          return true;
        }
        pSVar2 = pLVar8[uVar10].entryPoints.ptr;
        if (pSVar2 != (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                       *)0x0) {
          for (lVar9 = 0;
              lVar9 < (pSVar2->
                      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                      .count; lVar9 = lVar9 + 1) {
            this_01 = (pSVar2->
                      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                      .buffer.ptr[lVar9].ptr;
            if (this_01 != (LoopEntryPointInfo *)0x0) {
              bVar3 = EntryPointInfo::IsCodeGenPending(&this_01->super_EntryPointInfo);
              if (bVar3) {
                return false;
              }
              bVar3 = EntryPointInfo::IsCodeGenQueued(&this_01->super_EntryPointInfo);
              if (bVar3) {
                return false;
              }
              bVar3 = EntryPointInfo::IsCodeGenRecorded(&this_01->super_EntryPointInfo);
              if (bVar3) {
                return false;
              }
              bVar3 = EntryPointInfo::IsCodeGenDone(&this_01->super_EntryPointInfo);
              if ((bVar3) && (((this_01->super_EntryPointInfo).field_0x18 & 0x10) == 0)) {
                return false;
              }
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool FunctionBody::DoRedeferFunction(uint inactiveThreshold) const
    {
        if (!(this->GetFunctionInfo()->GetFunctionProxy() == this &&
              this->CanBeDeferred() &&
              this->GetByteCode() &&
              this->GetCanDefer()))
        {
            return false;
        }

        if (!PHASE_FORCE(Js::RedeferralPhase, this) && !PHASE_STRESS(Js::RedeferralPhase, this))
        {
            uint compileCount = this->GetCompileCount();
            if (compileCount >= (uint)CONFIG_FLAG(RedeferralCap))
            {
                return false;
            }
            // Redeferral threshold is k^x, where x is the number of previous compiles.
            bool overflow = false;
            uint currentThreshold = inactiveThreshold;
            if (compileCount > 1)
            {
                currentThreshold = JavascriptNumber::DirectPowIntInt(&overflow, inactiveThreshold, compileCount);
            }
            if (overflow)
            {
                currentThreshold = 0xFFFFFFFF;
            }
            if (this->GetInactiveCount() < currentThreshold)
            {
                return false;
            }
        }

        // Make sure the function won't be jitted
        bool isJitCandidate = false;
#if ENABLE_NATIVE_CODEGEN
        bool isJitModeFunction = !this->IsInterpreterExecutionMode();
        isJitCandidate = MapEntryPointsUntil([=](int index, FunctionEntryPointInfo *entryPointInfo)
        {
            if ((entryPointInfo->IsCodeGenPending() && isJitModeFunction) || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
            {
                return true;
            }
            return false;
        });

        if (!isJitCandidate)
        {
            // Now check loop body entry points
            isJitCandidate = MapLoopHeadersUntil([=](uint loopNumber, LoopHeader* header)
            {
                return header->MapEntryPointsUntil([&](int index, LoopEntryPointInfo* entryPointInfo)
                {
                    if (entryPointInfo->IsCodeGenPending() || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
                    {
                        return true;
                    }
                    return false;
                });
            });
        }
#endif

        return !isJitCandidate;
    }